

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_> *
testing::internal::
ActionResultHolder<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>::
PerformDefaultAction<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>(unsigned_int)>
          (FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
           *func_mocker,ArgumentTuple *args,string *call_description)

{
  ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
  *pAVar1;
  Result local_38;
  
  pAVar1 = (ActionResultHolder<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
            *)operator_new(0x20);
  FunctionMocker<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_(unsigned_int)>
  ::PerformDefaultAction(&local_38,func_mocker,args,call_description);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_00321e18;
  (pAVar1->result_).value_.
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (pAVar1->result_).value_.
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pAVar1->result_).value_.
  super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }